

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void heightOfExprList(ExprList *p,int *pnHeight)

{
  int iVar1;
  ExprList_item *pEVar2;
  int i;
  long lVar3;
  
  if (p != (ExprList *)0x0) {
    pEVar2 = p->a;
    for (lVar3 = 0; lVar3 < p->nExpr; lVar3 = lVar3 + 1) {
      if ((pEVar2->pExpr != (Expr *)0x0) && (iVar1 = pEVar2->pExpr->nHeight, *pnHeight < iVar1)) {
        *pnHeight = iVar1;
      }
      pEVar2 = pEVar2 + 1;
    }
  }
  return;
}

Assistant:

static void heightOfExprList(ExprList *p, int *pnHeight){
  if( p ){
    int i;
    for(i=0; i<p->nExpr; i++){
      heightOfExpr(p->a[i].pExpr, pnHeight);
    }
  }
}